

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

string * __thiscall
cmCoreTryCompile::LookupStdVar
          (string *__return_storage_ptr__,cmCoreTryCompile *this,string *var,bool warnCMP0067)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_23;
  undefined1 local_22;
  byte local_21;
  string *psStack_20;
  bool warnCMP0067_local;
  string *var_local;
  cmCoreTryCompile *this_local;
  string *value;
  
  local_22 = 0;
  local_21 = warnCMP0067;
  psStack_20 = var;
  var_local = (string *)this;
  this_local = (cmCoreTryCompile *)__return_storage_ptr__;
  pcVar1 = cmMakefile::GetSafeDefinition((this->super_cmCommand).Makefile,var);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_23);
  std::allocator<char>::~allocator((allocator<char> *)&local_23);
  if (((local_21 & 1) != 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::__cxx11::string::clear();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->WarnCMP0067,psStack_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCoreTryCompile::LookupStdVar(std::string const& var,
                                           bool warnCMP0067)
{
  std::string value = this->Makefile->GetSafeDefinition(var);
  if (warnCMP0067 && !value.empty()) {
    value.clear();
    this->WarnCMP0067.push_back(var);
  }
  return value;
}